

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O0

char * JlStrDup(char *SourceString)

{
  size_t sVar1;
  size_t stringSize;
  char *newString;
  char *SourceString_local;
  
  stringSize = 0;
  if (SourceString != (char *)0x0) {
    sVar1 = strlen(SourceString);
    stringSize = (size_t)WjTestLib_Calloc(sVar1 + 1,1);
    if ((void *)stringSize != (void *)0x0) {
      memcpy((void *)stringSize,SourceString,sVar1 + 1);
    }
  }
  return (char *)stringSize;
}

Assistant:

char*
    JlStrDup
    (
        char const*     SourceString
    )
{
    char* newString = NULL;

    if( NULL != SourceString )
    {
        size_t stringSize = strlen( SourceString ) + 1;
        newString = JlAlloc( stringSize );
        if( NULL != newString )
        {
            memcpy( newString, SourceString, stringSize );
        }
    }

    return newString;
}